

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawNegativeViewportHeightTests.cpp
# Opt level: O2

bool __thiscall
vkt::Draw::anon_unknown_0::NegativeViewportHeightTestInstance::isCulled
          (NegativeViewportHeightTestInstance *this,VkFrontFace triangleFace)

{
  VkFrontFace VVar1;
  VkCullModeFlagBits VVar2;
  bool bVar3;
  
  VVar1 = (this->m_params).frontFace;
  VVar2 = (this->m_params).cullMode;
  bVar3 = true;
  if (VVar2 != VK_CULL_MODE_FRONT_BIT || VVar1 != triangleFace) {
    bVar3 = VVar2 == VK_CULL_MODE_BACK_BIT && VVar1 != triangleFace ||
            VVar2 == VK_CULL_MODE_FRONT_AND_BACK;
  }
  return bVar3;
}

Assistant:

bool NegativeViewportHeightTestInstance::isCulled (const VkFrontFace triangleFace) const
{
	const bool isFrontFacing = (triangleFace == m_params.frontFace);

	if (m_params.cullMode == VK_CULL_MODE_FRONT_BIT && isFrontFacing)
		return true;
	if (m_params.cullMode == VK_CULL_MODE_BACK_BIT  && !isFrontFacing)
		return true;

	return m_params.cullMode == VK_CULL_MODE_FRONT_AND_BACK;
}